

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O2

pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* CLI::detail::split_program_name
            (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *__return_storage_ptr__,string *commandline)

{
  byte __c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *str;
  path_type pVar1;
  size_type __n;
  size_type sVar2;
  bool bVar3;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *__str;
  allocator<char> local_e1;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_b8;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  (__return_storage_ptr__->first)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->first).field_2;
  (__return_storage_ptr__->first)._M_string_length = 0;
  (__return_storage_ptr__->first).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->second)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->second).field_2;
  (__return_storage_ptr__->second)._M_string_length = 0;
  (__return_storage_ptr__->second).field_2._M_local_buf[0] = '\0';
  local_e0 = __return_storage_ptr__;
  trim(commandline);
  local_b8 = &__return_storage_ptr__->second;
  sVar2 = 1;
  __n = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                  (commandline,' ',1);
  do {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (&local_d8,commandline,0,__n);
    pVar1 = check_path(local_d8._M_dataplus._M_p);
    ::std::__cxx11::string::~string((string *)&local_d8);
    __str = local_e0;
    if (pVar1 == file) goto LAB_00191007;
    __n = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                    (commandline,' ',__n + 1);
  } while (__n != 0xffffffffffffffff);
  __c = *(commandline->_M_dataplus)._M_p;
  if ((__c - 0x22 < 0x3f) && ((0x4000000000000021U >> ((ulong)(__c - 0x22) & 0x3f) & 1) != 0)) {
    bVar3 = false;
    while (sVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   find(commandline,__c,sVar2), sVar2 != 0xffffffffffffffff) {
      if ((commandline->_M_dataplus)._M_p[sVar2 - 1] != '\\') {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                  (&local_d8,commandline,1,sVar2 - 1);
        __str = local_e0;
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (&local_e0->first,&local_d8);
        ::std::__cxx11::string::~string((string *)&local_d8);
        __n = sVar2 + 1;
        if (bVar3) {
          ::std::__cxx11::string::string((string *)&local_50,&__str->first);
          ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"\\",&local_e1);
          ::std::operator+(&local_70,&local_90,__c);
          local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
          local_b0._M_string_length = 1;
          local_b0.field_2._M_local_buf[1] = '\0';
          local_b0.field_2._M_local_buf[0] = __c;
          find_and_replace(&local_d8,&local_50,&local_70,&local_b0);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    (&__str->first,&local_d8);
          ::std::__cxx11::string::~string((string *)&local_d8);
          ::std::__cxx11::string::~string((string *)&local_b0);
          ::std::__cxx11::string::~string((string *)&local_70);
          ::std::__cxx11::string::~string((string *)&local_90);
          ::std::__cxx11::string::~string((string *)&local_50);
        }
        goto LAB_00191007;
      }
      sVar2 = sVar2 + 1;
      bVar3 = true;
    }
  }
  __n = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                  (commandline,' ',1);
  __str = local_e0;
LAB_00191007:
  if ((__str->first)._M_string_length == 0) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (&local_d8,commandline,0,__n);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&__str->first,&local_d8);
    ::std::__cxx11::string::~string((string *)&local_d8);
    rtrim(&__str->first);
  }
  if (__n < commandline->_M_string_length - 1) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (&local_d8,commandline,__n + 1,0xffffffffffffffff);
  }
  else {
    local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
    local_d8._M_string_length = 0;
    local_d8.field_2._M_local_buf[0] = '\0';
  }
  str = local_b8;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (local_b8,&local_d8);
  ::std::__cxx11::string::~string((string *)&local_d8);
  ltrim(str);
  return __str;
}

Assistant:

CLI11_INLINE std::pair<std::string, std::string> split_program_name(std::string commandline) {
    // try to determine the programName
    std::pair<std::string, std::string> vals;
    trim(commandline);
    auto esp = commandline.find_first_of(' ', 1);
    while(detail::check_path(commandline.substr(0, esp).c_str()) != path_type::file) {
        esp = commandline.find_first_of(' ', esp + 1);
        if(esp == std::string::npos) {
            // if we have reached the end and haven't found a valid file just assume the first argument is the
            // program name
            if(commandline[0] == '"' || commandline[0] == '\'' || commandline[0] == '`') {
                bool embeddedQuote = false;
                auto keyChar = commandline[0];
                auto end = commandline.find_first_of(keyChar, 1);
                while((end != std::string::npos) && (commandline[end - 1] == '\\')) {  // deal with escaped quotes
                    end = commandline.find_first_of(keyChar, end + 1);
                    embeddedQuote = true;
                }
                if(end != std::string::npos) {
                    vals.first = commandline.substr(1, end - 1);
                    esp = end + 1;
                    if(embeddedQuote) {
                        vals.first = find_and_replace(vals.first, std::string("\\") + keyChar, std::string(1, keyChar));
                    }
                } else {
                    esp = commandline.find_first_of(' ', 1);
                }
            } else {
                esp = commandline.find_first_of(' ', 1);
            }

            break;
        }
    }
    if(vals.first.empty()) {
        vals.first = commandline.substr(0, esp);
        rtrim(vals.first);
    }

    // strip the program name
    vals.second = (esp < commandline.length() - 1) ? commandline.substr(esp + 1) : std::string{};
    ltrim(vals.second);
    return vals;
}